

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O1

void __thiscall variant_visit_A_Test::TestBody(variant_visit_A_Test *this)

{
  undefined8 *puVar1;
  char *message;
  AssertionResult gtest_ar;
  storage_type local_30;
  undefined4 uStack_2c;
  storage_type local_28;
  index_type iStack_24;
  AssertHelper local_20;
  internal local_18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  _local_28 = 0;
  state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B>::
  emplace<(anonymous_namespace)::A,_const_int_&,_0>
            ((Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B> *)&local_28.__align,
             &TestBody::expected);
  if (iStack_24 == '\x01') {
    state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B>::
    get<(anonymous_namespace)::A,_0>
              ((Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B> *)&local_28.__align);
  }
  else {
    if (iStack_24 == '\0') {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = &PTR__exception_00152c70;
      __cxa_throw(puVar1,&state_machine::variant::bad_variant_access::typeinfo,
                  std::exception::~exception);
    }
    state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B>::
    get<(anonymous_namespace)::B,_0>
              ((Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B> *)&local_28.__align);
  }
  local_30 = local_28;
  testing::internal::CmpHelperEQ<int,int>
            (local_18,"v.visit([](auto& a) { return a.value; })","expected",(int *)local_30.__data,
             &TestBody::expected);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30.__align);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_variant.cc"
               ,0xc1,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_30.__align);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((long *)CONCAT44(uStack_2c,local_30) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_2c,local_30) + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B>::~Variant
            ((Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B> *)&local_28.__align);
  return;
}

Assistant:

TEST(variant, visit_A) {
    static constexpr int expected = 42;
    Variant<A, B> v{};

    v.emplace<A>(expected);

    EXPECT_EQ(v.visit([](auto& a) { return a.value; }), expected);
}